

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_853dad::HandleAppendStringCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  string *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  pointer __x;
  string_view value;
  string local_110;
  string inputPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  cmCMakePath path;
  OutputVariable arguments;
  
  if ((anonymous_namespace)::
      HandleAppendStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleAppendStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar4 != 0) {
      ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
      ArgumentParserWithOutputVariable
                (&HandleAppendStringCommand::parser.
                  super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>);
      __cxa_atexit(CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::
                   ~CMakePathArgumentParser,&HandleAppendStringCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleAppendStringCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::Parse<2>
            (&arguments,
             &HandleAppendStringCommand::parser.
              super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>,args);
  bVar2 = ArgumentParser::ParseResult::MaybeReportError
                    (&arguments.super_ParseResult,status->Makefile);
  bVar3 = true;
  if (!bVar2) {
    inputPath._M_dataplus._M_p = (pointer)&inputPath.field_2;
    inputPath._M_string_length = 0;
    inputPath.field_2._M_local_buf[0] = '\0';
    bVar3 = getInputPath((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1,status,&inputPath);
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_d0,(string *)&inputPath);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&path,&local_d0,generic_format);
      std::__cxx11::string::~string((string *)&local_d0);
      pbVar1 = HandleAppendStringCommand::parser.
               super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>.
               super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>.Inputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__x = HandleAppendStringCommand::parser.
                 super_ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>.
                 super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>.Inputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != pbVar1; __x = __x + 1) {
        std::filesystem::__cxx11::path::concat<std::__cxx11::string>(&path.Path,__x);
      }
      this = status->Makefile;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::filesystem::__cxx11::path::string(&local_110,&path.Path);
      name = pbVar1 + 1;
      if (arguments.Output.
          super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_engaged != false) {
        name = (string *)&arguments.Output;
      }
      value._M_str = local_110._M_dataplus._M_p;
      value._M_len = local_110._M_string_length;
      cmMakefile::AddDefinition(this,name,value);
      std::__cxx11::string::~string((string *)&local_110);
      std::filesystem::__cxx11::path::~path(&path.Path);
    }
    std::__cxx11::string::~string((string *)&inputPath);
  }
  OutputVariable::~OutputVariable(&arguments);
  return bVar3;
}

Assistant:

bool HandleAppendStringCommand(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
  static OutputVariableParser const parser{};

  const auto arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  cmCMakePath path(inputPath);
  for (const auto& input : parser.GetInputs()) {
    path += input;
  }

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}